

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O3

TCompareResult __thiscall
Refal2::CArbitraryInteger::Compare(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  pointer puVar1;
  byte bVar2;
  TCompareResult TVar3;
  pointer puVar4;
  
  puVar1 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while ((puVar1 != puVar4 && (puVar4 = puVar4 + -1, *puVar4 == 0))) {
    (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar4;
  }
  puVar1 = (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while ((puVar1 != puVar4 && (puVar4 = puVar4 + -1, *puVar4 == 0))) {
    (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar4;
  }
  bVar2 = this->isNegative;
  if ((bool)bVar2 == operand->isNegative) {
    TVar3 = compare(this,operand);
    if (TVar3 == CR_Less) {
      TVar3 = (uint)this->isNegative + CR_Less;
      goto LAB_001198d8;
    }
    if (TVar3 == CR_Equal) {
      return CR_Equal;
    }
    bVar2 = this->isNegative;
  }
  TVar3 = -(bVar2 & 1);
LAB_001198d8:
  return TVar3 | CR_Great;
}

Assistant:

CArbitraryInteger::TCompareResult CArbitraryInteger::Compare(
	const CArbitraryInteger& operand ) const
{
	const_cast<CArbitraryInteger&>( *this ).removeLeadingZeros();
	const_cast<CArbitraryInteger&>( operand ).removeLeadingZeros();
	if( IsNegative() == operand.IsNegative() ) {
		switch( compare( operand ) ) {
			case CR_Less:
				return ( IsNegative() ? CR_Great : CR_Less );
			case CR_Equal:
				return CR_Equal;
			case CR_Great:
				break;
			default:
				assert( false );
				break;
		}
	}
	return ( IsNegative() ? CR_Less : CR_Great );
}